

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_fraction.h
# Opt level: O3

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_int,9u>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               fraction_t<unsigned_int,_9U> *fmt)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar13 [16];
  uint uVar15;
  undefined1 auVar14 [16];
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  
  lVar3 = 0;
  uVar5 = 0;
  while ((end->m_position != pos->m_position &&
         (0xf5 < (byte)(pos->m_cache[pos->m_position] - 0x3aU)))) {
    uVar5 = ((uint)(byte)pos->m_cache[pos->m_position] + uVar5 * 10) - 0x30;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
    lVar3 = lVar3 + -1;
    if (lVar3 == -9) {
LAB_00109a54:
      *fmt->value = uVar5;
      return true;
    }
  }
  if (lVar3 == 0) {
    return false;
  }
  if ((ulong)-lVar3 < 8 || lVar3 == -8) {
    lVar4 = lVar3 + 8;
    auVar10._8_4_ = (int)lVar4;
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 4;
    uVar16 = 1;
    uVar2 = 1;
    uVar15 = 1;
    do {
      uVar9 = uVar15;
      uVar8 = uVar2;
      uVar7 = uVar16;
      uVar6 = uVar5;
      uVar5 = uVar6 * 10;
      uVar2 = uVar8 * 10;
      auVar13._4_4_ = uVar7;
      auVar13._0_4_ = uVar7;
      auVar13._8_4_ = uVar9;
      auVar13._12_4_ = uVar9;
      uVar15 = (uint)((auVar13._8_8_ & 0xffffffff) * 10);
      lVar1 = (lVar3 + 0xcU & 0xfffffffffffffffc) + lVar4;
      lVar4 = lVar4 + -4;
      uVar16 = uVar7 * 10;
    } while (lVar1 != 8);
    lVar4 = -lVar4;
    auVar14._8_4_ = (int)lVar4;
    auVar14._0_8_ = lVar4;
    auVar14._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar10 = auVar10 ^ _DAT_0010a060;
    auVar13 = (auVar14 | _DAT_0010a050) ^ _DAT_0010a060;
    iVar11 = auVar10._4_4_;
    iVar12 = auVar10._12_4_;
    auVar14 = (_DAT_0010a040 | auVar14) ^ _DAT_0010a060;
    uVar16 = -(uint)(iVar11 < auVar14._4_4_ ||
                    auVar14._4_4_ == iVar11 && auVar10._0_4_ < auVar14._0_4_);
    uVar17 = -(uint)(iVar12 < auVar14._12_4_ ||
                    auVar14._12_4_ == iVar12 && auVar10._8_4_ < auVar14._8_4_);
    uVar18 = -(uint)(iVar11 < auVar13._4_4_ ||
                    auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_);
    uVar19 = -(uint)(iVar12 < auVar13._12_4_ ||
                    auVar13._12_4_ == iVar12 && auVar10._8_4_ < auVar13._8_4_);
    uVar5 = (~uVar18 & uVar2 | uVar8 & uVar18) * (~uVar16 & uVar5 | uVar6 & uVar16) *
            (~uVar17 & uVar7 * 10 | uVar7 & uVar17) * (~uVar19 & uVar15 | uVar9 & uVar19);
  }
  goto LAB_00109a54;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, fraction_t<UnsignedInt, Width>& fmt, Others&&... others)
{
    using char_type  = typename iterator_traits<Iterator>::value_type;

    auto x = UnsignedInt{ 0 };
    auto count = std::size_t{ 0 };
    while (count < Width)
    {
        if (pos == end)
            break;

        const char_type ch = *pos;
        if ((ch < char_type{ '0' }) || (ch > char_type{ '9' }))
            break;

        x = 10 * x + static_cast<UnsignedInt>(ch - char_type{ '0' });
        ++count;
        ++pos; 
    }

    if (count == 0)
        return false;

    while (count < Width)
    {
        x = 10 * x;
        ++count;
    }
    
    fmt.value = x;
    return read_impl(pos, end, std::forward<Others>(others)...);
}